

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O2

REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_CELL ref_cell;
  REF_GEOM pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_DBL *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  int cell;
  ulong uVar10;
  REF_INT positive;
  REF_INT negative;
  REF_DBL max_normdev;
  REF_DBL min_normdev;
  REF_DBL normdev;
  REF_INT max_id;
  REF_GEOM local_c8;
  REF_INT min_id;
  ulong local_b8;
  REF_MPI local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  pRVar2 = ref_grid->geom;
  uVar3 = ref_cell_id_range(ref_cell,pRVar1,&min_id,&max_id);
  if (uVar3 == 0) {
    uVar9 = (ulong)min_id;
    if ((long)uVar9 < 1) {
      pcVar8 = "expected min_id greater then zero";
      uVar7 = 0x3c7;
    }
    else {
      uVar10 = (ulong)max_id;
      pRVar2->nface = max_id;
      local_b0 = pRVar1;
      if (-1 < (long)uVar10) {
        pRVar5 = (REF_DBL *)malloc(uVar10 * 8);
        pRVar2->uv_area_sign = pRVar5;
        if (pRVar5 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3c9,"ref_meshlink_infer_orientation",
                 "malloc ref_geom->uv_area_sign of REF_DBL NULL");
          return 2;
        }
        for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
          pRVar5[uVar6] = 1.0;
        }
        local_c8 = pRVar2;
        while( true ) {
          if ((long)(int)uVar10 < (long)uVar9) {
            return 0;
          }
          min_normdev = 2.0;
          max_normdev = -2.0;
          negative = 0;
          positive = 0;
          for (cell = 0; pRVar1 = local_b0, cell < ref_cell->max; cell = cell + 1) {
            RVar4 = ref_cell_nodes(ref_cell,cell,nodes);
            if ((RVar4 == 0) && (nodes[ref_cell->node_per] == (int)uVar9)) {
              uVar3 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
              if (uVar3 != 0) {
                uVar9 = (ulong)uVar3;
                pcVar8 = "norm dev";
                uVar7 = 0x3d2;
                goto LAB_001acb96;
              }
              if (normdev <= min_normdev) {
                min_normdev = normdev;
              }
              if (max_normdev <= normdev) {
                max_normdev = normdev;
              }
              if (0.0 <= normdev) {
                positive = positive + 1;
              }
              else {
                negative = negative + 1;
              }
            }
          }
          normdev = min_normdev;
          local_b8 = uVar9;
          uVar3 = ref_mpi_min(local_b0,&normdev,&min_normdev,3);
          if (uVar3 != 0) break;
          uVar3 = ref_mpi_bcast(pRVar1,&min_normdev,1,3);
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar8 = "min";
            uVar7 = 0x3dd;
            goto LAB_001acb96;
          }
          normdev = max_normdev;
          uVar3 = ref_mpi_max(pRVar1,&normdev,&max_normdev,3);
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar8 = "mpi max";
            uVar7 = 0x3df;
            goto LAB_001acb96;
          }
          uVar3 = ref_mpi_bcast(pRVar1,&max_normdev,1,3);
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar8 = "max";
            uVar7 = 0x3e0;
            goto LAB_001acb96;
          }
          uVar3 = ref_mpi_allsum(pRVar1,&positive,1,1);
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar8 = "mpi sum";
            uVar7 = 0x3e1;
            goto LAB_001acb96;
          }
          uVar3 = ref_mpi_allsum(pRVar1,&negative,1,1);
          uVar9 = local_b8;
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar8 = "mpi sum";
            uVar7 = 0x3e2;
            goto LAB_001acb96;
          }
          if ((min_normdev <= 1.5) || (-1.5 <= max_normdev)) {
            if (positive < negative) {
              local_c8->uv_area_sign[local_b8 - 1] = -1.0;
            }
            if (pRVar1->id == 0) {
              printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
                     local_c8->uv_area_sign[local_b8 - 1],min_normdev,max_normdev,
                     local_b8 & 0xffffffff);
            }
          }
          else {
            local_c8->uv_area_sign[local_b8 - 1] = 0.0;
          }
          uVar9 = uVar9 + 1;
          uVar10 = (ulong)(uint)max_id;
        }
        uVar9 = (ulong)uVar3;
        pcVar8 = "mpi max";
        uVar7 = 0x3dc;
        goto LAB_001acb96;
      }
      pcVar8 = "malloc ref_geom->uv_area_sign of REF_DBL negative";
      uVar7 = 0x3c9;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           uVar7,"ref_meshlink_infer_orientation",pcVar8);
    RVar4 = 1;
  }
  else {
    uVar9 = (ulong)uVar3;
    pcVar8 = "id range";
    uVar7 = 0x3c6;
LAB_001acb96:
    RVar4 = (REF_STATUS)uVar9;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           uVar7,"ref_meshlink_infer_orientation",uVar9,pcVar8);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT min_id, max_id, id;
  REF_DBL normdev, min_normdev, max_normdev;
  REF_INT negative, positive;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  RAS(min_id > 0, "expected min_id greater then zero");
  ref_geom->nface = max_id;
  ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 1.0);

  for (id = min_id; id <= max_id; id++) {
    min_normdev = 2.0;
    max_normdev = -2.0;
    negative = 0;
    positive = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
      max_normdev = MAX(max_normdev, normdev);
      if (normdev < 0.0) {
        negative++;
      } else {
        positive++;
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    normdev = max_normdev;
    RSS(ref_mpi_max(ref_mpi, &normdev, &max_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_normdev, 1, REF_DBL_TYPE), "max");
    RSS(ref_mpi_allsum(ref_mpi, &positive, 1, REF_INT_TYPE), "mpi sum");
    RSS(ref_mpi_allsum(ref_mpi, &negative, 1, REF_INT_TYPE), "mpi sum");
    if (min_normdev > 1.5 && max_normdev < -1.5) {
      ref_geom->uv_area_sign[id - 1] = 0.0;
    } else {
      if (positive < negative) ref_geom->uv_area_sign[id - 1] = -1.0;
      if (ref_mpi_once(ref_mpi))
        printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
               id, ref_geom->uv_area_sign[id - 1], min_normdev, negative,
               positive, max_normdev);
    }
  }

  return REF_SUCCESS;
}